

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O0

void png_write_chunk_end(png_structrp png_ptr)

{
  png_byte local_14 [4];
  png_structrp ppStack_10;
  png_byte buf [4];
  png_structrp png_ptr_local;
  
  if (png_ptr != (png_structrp)0x0) {
    png_ptr->io_state = 0x82;
    ppStack_10 = png_ptr;
    png_save_uint_32(local_14,png_ptr->crc);
    png_write_data(ppStack_10,local_14,4);
  }
  return;
}

Assistant:

void PNGAPI
png_write_chunk_end(png_structrp png_ptr)
{
   png_byte buf[4];

   if (png_ptr == NULL) return;

#ifdef PNG_IO_STATE_SUPPORTED
   /* Inform the I/O callback that the chunk CRC is being written.
    * PNG_IO_CHUNK_CRC requires a single I/O function call.
    */
   png_ptr->io_state = PNG_IO_WRITING | PNG_IO_CHUNK_CRC;
#endif

   /* Write the crc in a single operation */
   png_save_uint_32(buf, png_ptr->crc);

   png_write_data(png_ptr, buf, 4);
}